

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall
kj::UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
          (ChildExitPromiseAdapter *this,PromiseFulfiller<int> *fulfiller,ChildSet *childSet,
          Maybe<int> *pidRef)

{
  pair<std::_Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_bool>
  pVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  this->childSet = childSet;
  if ((pidRef->ptr).isSet == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xfb,FAILED,"pidRef != nullptr",
               "\"`pid` must be non-null at the time `onChildExit()` is called\"",
               (char (*) [61])"`pid` must be non-null at the time `onChildExit()` is called");
    kj::_::Debug::Fault::fatal(&f);
  }
  f.exception._0_4_ = (pidRef->ptr).field_1;
  this->pid = (pid_t)f.exception._0_4_;
  this->pidRef = pidRef;
  this->fulfiller = fulfiller;
  pVar1 = std::
          _Rb_tree<int,std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>,std::_Select1st<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
          ::_M_emplace_unique<std::pair<int,kj::UnixEventPort::ChildExitPromiseAdapter*>>
                    ((_Rb_tree<int,std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>,std::_Select1st<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
                      *)childSet,(pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> *)&f);
  _kjCondition.value = pVar1.second;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,0xfe,FAILED,"childSet.waiters.insert(std::make_pair(pid, this)).second",
             "_kjCondition,\"already called onChildExit() for this pid\"",&_kjCondition,
             (char (*) [42])"already called onChildExit() for this pid");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

inline ChildExitPromiseAdapter(PromiseFulfiller<int>& fulfiller,
                                 ChildSet& childSet, Maybe<pid_t>& pidRef)
      : childSet(childSet),
        pid(KJ_REQUIRE_NONNULL(pidRef,
            "`pid` must be non-null at the time `onChildExit()` is called")),
        pidRef(pidRef), fulfiller(fulfiller) {
    KJ_REQUIRE(childSet.waiters.insert(std::make_pair(pid, this)).second,
        "already called onChildExit() for this pid");
  }